

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSat.c
# Opt level: O2

DdNode * Cudd_Eval(DdManager *dd,DdNode *f,int *inputs)

{
  uint *puVar1;
  uint uVar2;
  
  uVar2 = (uint)f & 1;
  do {
    puVar1 = (uint *)((ulong)f & 0xfffffffffffffffe);
    while( true ) {
      if ((ulong)*puVar1 == 0x7fffffff) {
        return (DdNode *)((ulong)puVar1 ^ (ulong)uVar2);
      }
      if (inputs[*puVar1] != 1) break;
      puVar1 = *(uint **)(puVar1 + 4);
    }
    f = *(DdNode **)(puVar1 + 6);
    uVar2 = uVar2 ^ (uint)f & 1;
  } while( true );
}

Assistant:

DdNode *
Cudd_Eval(
  DdManager * dd,
  DdNode * f,
  int * inputs)
{
    int comple;
    DdNode *ptr;

    comple = Cudd_IsComplement(f);
    ptr = Cudd_Regular(f);

    while (!cuddIsConstant(ptr)) {
        if (inputs[ptr->index] == 1) {
            ptr = cuddT(ptr);
        } else {
            comple ^= Cudd_IsComplement(cuddE(ptr));
            ptr = Cudd_Regular(cuddE(ptr));
        }
    }
    return(Cudd_NotCond(ptr,comple));

}